

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O3

void __thiscall amrex::BoxArray::BoxArray(BoxArray *this,BoxList *bl)

{
  uint uVar1;
  undefined1 local_9;
  
  uVar1 = (bl->btype).itype;
  (this->m_bat).m_bat_type = (uint)(uVar1 != 0);
  if (uVar1 != 0) {
    (this->m_bat).m_op.m_indexType.m_typ.itype = uVar1;
  }
  (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<amrex::BARef,std::allocator<amrex::BARef>,amrex::BoxList_const&>
            (&(this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(BARef **)&this->m_ref,(allocator<amrex::BARef> *)&local_9,bl);
  (this->m_simplified_list).super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_simplified_list).super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  type_update(this);
  return;
}

Assistant:

BoxArray::BoxArray (const BoxList& bl)
    :
    m_bat(bl.ixType()),
    m_ref(std::make_shared<BARef>(bl))
{
    type_update();
}